

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O0

int If_ManImproveNodeFaninCompact_int
              (If_Man_t *p,If_Obj_t *pObj,int nLimit,Vec_Ptr_t *vFront,Vec_Ptr_t *vVisited)

{
  int iVar1;
  Vec_Ptr_t *vVisited_local;
  Vec_Ptr_t *vFront_local;
  int nLimit_local;
  If_Obj_t *pObj_local;
  If_Man_t *p_local;
  
  iVar1 = If_ManImproveNodeFaninCompact0(p,pObj,nLimit,vFront,vVisited);
  if (iVar1 == 0) {
    iVar1 = Vec_PtrSize(vFront);
    if ((iVar1 < nLimit) &&
       (iVar1 = If_ManImproveNodeFaninCompact1(p,pObj,nLimit,vFront,vVisited), iVar1 != 0)) {
      return 1;
    }
    iVar1 = Vec_PtrSize(vFront);
    if (nLimit < iVar1) {
      __assert_fail("Vec_PtrSize(vFront) <= nLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifReduce.c"
                    ,0x1b7,
                    "int If_ManImproveNodeFaninCompact_int(If_Man_t *, If_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    p_local._4_4_ = 0;
  }
  else {
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int If_ManImproveNodeFaninCompact_int( If_Man_t * p, If_Obj_t * pObj, int nLimit, Vec_Ptr_t * vFront, Vec_Ptr_t * vVisited )
{
    if ( If_ManImproveNodeFaninCompact0(p, pObj, nLimit, vFront, vVisited) )
        return 1;
    if (  Vec_PtrSize(vFront) < nLimit && If_ManImproveNodeFaninCompact1(p, pObj, nLimit, vFront, vVisited) )
        return 1;
//    if ( Vec_PtrSize(vFront) < nLimit && If_ManImproveNodeFaninCompact2(p, pObj, nLimit, vFront, vVisited) )
//        return 1;
    assert( Vec_PtrSize(vFront) <= nLimit );
    return 0;
}